

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

void __thiscall
Rml::ElementHandleTargetData::ElementHandleTargetData
          (ElementHandleTargetData *this,Element *target,Context *context,
          Array<NumericValue,_NUM_EDGES> *edge_margin)

{
  Position PVar1;
  ComputedValues *pCVar2;
  Box *pBVar3;
  Vector2f VVar4;
  Array<float,_NUM_EDGES> AVar5;
  Array<NumericValue,_NUM_EDGES> *edge_margin_local;
  Context *context_local;
  Element *target_local;
  ElementHandleTargetData *this_local;
  
  this->target = target;
  pCVar2 = Element::GetComputedValues(target);
  this->computed = pCVar2;
  pBVar3 = Element::GetBox(target);
  this->box = pBVar3;
  pBVar3 = GetParentBox(target,context);
  this->parent_box = pBVar3;
  VVar4 = Element::GetContainingBlock(target);
  this->containing_block = VVar4;
  PVar1 = Style::ComputedValues::position(this->computed);
  this->position = PVar1;
  AVar5 = ResolveEdgeMargin(target,this->box,edge_margin);
  *&(this->resolved_edge_margin)._M_elems = AVar5._M_elems;
  SetDefiniteMargins(this);
  return;
}

Assistant:

ElementHandleTargetData(Element* target, Context* context, const Array<NumericValue, NUM_EDGES>& edge_margin) :
		target(target), computed(target->GetComputedValues()), box(target->GetBox()), parent_box(GetParentBox(target, context)),
		containing_block(target->GetContainingBlock()), position(computed.position()),
		resolved_edge_margin(ResolveEdgeMargin(target, box, edge_margin))
	{
		SetDefiniteMargins();
	}